

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O0

int xmllintShellValidate(xmllintShellCtxtPtr ctxt,char *dtd,xmlNodePtr node,xmlNodePtr node2)

{
  long lVar1;
  xmlDtdPtr subset;
  xmllintShellCtxtPtr pxStack_a0;
  int res;
  xmlValidCtxt vctxt;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *dtd_local;
  xmllintShellCtxtPtr ctxt_local;
  
  subset._4_4_ = -1;
  if ((ctxt == (xmllintShellCtxtPtr)0x0) || (ctxt->doc == (xmlDocPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    vctxt.state = (xmlAutomataStatePtr)node2;
    memset(&stack0xffffffffffffff60,0,0x70);
    vctxt.userData = xmllintShellPrintf;
    vctxt.error = xmllintShellPrintf;
    pxStack_a0 = ctxt;
    if ((dtd == (char *)0x0) || (*dtd == '\0')) {
      subset._4_4_ = xmlValidateDocument(&stack0xffffffffffffff60,ctxt->doc);
    }
    else {
      lVar1 = xmlParseDTD(0,dtd);
      if (lVar1 != 0) {
        subset._4_4_ = xmlValidateDtd(&stack0xffffffffffffff60,ctxt->doc,lVar1);
        xmlFreeDtd(lVar1);
      }
    }
    ctxt_local._4_4_ = subset._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmllintShellValidate(xmllintShellCtxtPtr ctxt, char *dtd,
                 xmlNodePtr node ATTRIBUTE_UNUSED,
                 xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlValidCtxt vctxt;
    int res = -1;

    if ((ctxt == NULL) || (ctxt->doc == NULL)) return(-1);
    memset(&vctxt, 0, sizeof(vctxt));
    vctxt.error = xmllintShellPrintf;
    vctxt.warning = xmllintShellPrintf;
    vctxt.userData = ctxt;

    if ((dtd == NULL) || (dtd[0] == 0)) {
        res = xmlValidateDocument(&vctxt, ctxt->doc);
    } else {
        xmlDtdPtr subset;

        subset = xmlParseDTD(NULL, (xmlChar *) dtd);
        if (subset != NULL) {
            res = xmlValidateDtd(&vctxt, ctxt->doc, subset);

            xmlFreeDtd(subset);
        }
    }
    return (res);
}